

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_struct_writer
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  undefined8 tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_const_value *ptVar7;
  t_type *ptVar8;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188 [8];
  string _v;
  string local_148;
  undefined1 local_128 [8];
  string mname;
  t_field *tmember;
  t_field **local_f8;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string f;
  string local_a0;
  undefined1 local_80 [8];
  string str;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  t_struct *tstruct_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  name.field_2._8_8_ = tstruct;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar2));
  this_00 = t_struct::get_sorted_members((t_struct *)name.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"_str",(allocator *)(f.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_80,(t_generator *)this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(f.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"_f",&local_e9);
  t_generator::tmp((string *)local_c8,(t_generator *)this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"method write (oprot : Protocol.t) =");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"oprot#writeStructBegin \"");
  poVar4 = std::operator<<(poVar4,(string *)&fields);
  poVar4 = std::operator<<(poVar4,"\";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_f8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  str.field_2._8_8_ = local_f8;
  while( true ) {
    tmember = (t_field *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&str.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&tmember);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&str.field_2 + 8));
    mname.field_2._8_8_ = *pptVar5;
    psVar6 = t_field::get_name_abi_cxx11_((t_field *)mname.field_2._8_8_);
    std::__cxx11::string::string((string *)(_v.field_2._M_local_buf + 8),(string *)psVar6);
    t_generator::decapitalize(&local_148,(t_generator *)this,(string *)((long)&_v.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "_",&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)(_v.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_188);
    bVar1 = struct_member_persistent(this,(t_field *)mname.field_2._8_8_);
    if (bVar1) {
      bVar1 = struct_member_omitable(this,(t_field *)mname.field_2._8_8_);
      if ((bVar1) &&
         (bVar1 = struct_member_default_cheaply_comparable(this,(t_field *)mname.field_2._8_8_),
         bVar1)) {
        std::__cxx11::string::operator=(local_188,"_v");
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"(match ");
        poVar4 = std::operator<<(poVar4,(string *)local_128);
        poVar4 = std::operator<<(poVar4," with ");
        ptVar8 = t_field::get_type((t_field *)mname.field_2._8_8_);
        ptVar7 = t_field::get_value((t_field *)mname.field_2._8_8_);
        render_const_value_abi_cxx11_(&local_1a8,this,ptVar8,ptVar7);
        poVar4 = std::operator<<(poVar4,(string *)&local_1a8);
        poVar4 = std::operator<<(poVar4," -> () | ");
        poVar4 = std::operator<<(poVar4,local_188);
        poVar4 = std::operator<<(poVar4," -> ");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        std::__cxx11::string::operator=(local_188,(string *)local_128);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"(");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"(match ");
      poVar4 = std::operator<<(poVar4,(string *)local_128);
      std::operator<<(poVar4," with ");
      bVar1 = struct_member_omitable(this,(t_field *)mname.field_2._8_8_);
      if (bVar1) {
        std::operator<<(out,"None -> ()");
        bVar1 = struct_member_default_cheaply_comparable(this,(t_field *)mname.field_2._8_8_);
        if (bVar1) {
          poVar4 = std::operator<<(out," | Some ");
          ptVar8 = t_field::get_type((t_field *)mname.field_2._8_8_);
          ptVar7 = t_field::get_value((t_field *)mname.field_2._8_8_);
          render_const_value_abi_cxx11_(&local_1c8,this,ptVar8,ptVar7);
          poVar4 = std::operator<<(poVar4,(string *)&local_1c8);
          std::operator<<(poVar4," -> ()");
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        poVar4 = std::operator<<(out," | Some _v -> ");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"| None -> raise (Field_empty \"");
        type_name_abi_cxx11_(&local_1e8,this,(t_type *)name.field_2._8_8_);
        poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
        poVar4 = std::operator<<(poVar4,".");
        poVar4 = std::operator<<(poVar4,(string *)local_128);
        poVar4 = std::operator<<(poVar4,"\")");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1e8);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"| Some _v -> ");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::operator=(local_188,"_v");
    }
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"oprot#writeFieldBegin(\"");
    psVar6 = t_field::get_name_abi_cxx11_((t_field *)mname.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"\",");
    ptVar8 = t_field::get_type((t_field *)mname.field_2._8_8_);
    type_to_enum_abi_cxx11_(&local_208,this,ptVar8);
    poVar4 = std::operator<<(poVar4,(string *)&local_208);
    poVar4 = std::operator<<(poVar4,",");
    iVar3 = t_field::get_key((t_field *)mname.field_2._8_8_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_208);
    tfield = mname.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_228,local_188);
    generate_serialize_field(this,out,(t_field *)tfield,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"oprot#writeFieldEnd");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string((string *)local_128);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&str.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_248);
  poVar4 = std::operator<<(poVar4,"oprot#writeFieldStop;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_268);
  poVar4 = std::operator<<(poVar4,"oprot#writeStructEnd");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  string str = tmp("_str");
  string f = tmp("_f");

  indent(out) << "method write (oprot : Protocol.t) =" << endl;
  indent_up();
  indent(out) << "oprot#writeStructBegin \"" << name << "\";" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* tmember = (*f_iter);
    string mname = "_" + decapitalize(tmember->get_name());
    string _v;

    if (struct_member_persistent(tmember)) {

      if (struct_member_omitable(tmember) && struct_member_default_cheaply_comparable(tmember)) {
        _v = "_v";
        // Avoid redundant encoding of members having default values.
        indent(out) << "(match " << mname << " with "
                    << render_const_value(tmember->get_type(), tmember->get_value()) << " -> () | "
                    << _v << " -> " << endl;
      } else {
        _v = mname;
        indent(out) << "(" << endl;
      }

    } else {

      indent(out) << "(match " << mname << " with ";

      if (struct_member_omitable(tmember)) {
        out << "None -> ()";

        if (struct_member_default_cheaply_comparable(tmember)) {
          // Avoid redundant encoding of members having default values.
          out << " | Some " << render_const_value(tmember->get_type(), tmember->get_value())
              << " -> ()";
        }
        out << " | Some _v -> " << endl;
      } else {
        out << endl;
        indent(out) << "| None -> raise (Field_empty \"" << type_name(tstruct) << "." << mname
                    << "\")" << endl;
        indent(out) << "| Some _v -> " << endl;
      }

      _v = "_v";
    }
    indent_up();
    // Write field header
    indent(out) << "oprot#writeFieldBegin(\"" << tmember->get_name() << "\","
                << type_to_enum(tmember->get_type()) << "," << tmember->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, tmember, _v);

    // Write field closer
    indent(out) << "oprot#writeFieldEnd" << endl;

    indent_down();
    indent(out) << ");" << endl;
  }

  // Write the struct map
  out << indent() << "oprot#writeFieldStop;" << endl << indent() << "oprot#writeStructEnd" << endl;

  indent_down();
}